

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.h
# Opt level: O0

float Unit_Test::randomFloatValue<float>(float minimum,float maximum,float stepVal)

{
  int iVar1;
  float in_XMM0_Da;
  undefined1 auVar2 [12];
  float in_XMM1_Da;
  undefined1 auVar3 [16];
  float in_XMM2_Da;
  int range;
  int local_14;
  float local_4;
  
  local_4 = in_XMM0_Da;
  if ((in_XMM0_Da <= in_XMM1_Da) && (0.0 <= in_XMM2_Da)) {
    auVar2 = SUB6012((undefined1  [60])0x0,0);
    local_14 = (int)((in_XMM1_Da - in_XMM0_Da) / in_XMM2_Da);
    if (local_14 < 1) {
      local_14 = 1;
    }
    iVar1 = rand();
    auVar3._0_4_ = (float)(iVar1 % local_14);
    auVar3._4_12_ = auVar2;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)in_XMM2_Da),auVar3,ZEXT416((uint)in_XMM0_Da));
    local_4 = auVar3._0_4_;
  }
  return local_4;
}

Assistant:

data randomFloatValue( data minimum, data maximum, data stepVal )
    {
        if (minimum > maximum || stepVal < 0)
            return minimum;

        int range = static_cast<int>( (maximum - minimum) / stepVal );
        if (range <= 0)
            range = 1;

        return static_cast<data>(rand() % range) * stepVal + minimum;
    }